

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::AddSiteProperties(cmCTest *this,cmXMLWriter *xml)

{
  cmState *pcVar1;
  pointer pbVar2;
  cmCTestGenericHandler *pcVar3;
  char *pcVar4;
  pointer value;
  string l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *label;
  char *subproject;
  string local_a0;
  allocator<char> local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  _Base_ptr local_40;
  char *local_38;
  
  pcVar3 = GetHandler(this,"script");
  local_40 = pcVar3[4].Options._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  if (local_40 != (_Base_ptr)0x0) {
    pcVar1 = (cmState *)local_40[0x18]._M_right;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"SubProject",(allocator<char> *)&local_60);
    pcVar4 = cmState::GetGlobalProperty(pcVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    local_38 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Subproject",(allocator<char> *)&local_60);
      cmXMLWriter::StartElement(xml,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      cmXMLWriter::Attribute<char_const*>(xml,"name",&local_38);
      pcVar1 = (cmState *)
               pcVar3[4].Options._M_t._M_impl.super__Rb_tree_header._M_header._M_right[0x18].
               _M_right;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"SubProjectLabels",(allocator<char> *)&local_60);
      pcVar4 = cmState::GetGlobalProperty(pcVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"Labels",(allocator<char> *)&local_60);
        cmXMLWriter::StartElement(xml,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,pcVar4,(allocator<char> *)&local_60);
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&local_a0,&local_78,false);
        pbVar2 = local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (value = local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; value != pbVar2; value = value + 1)
        {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Label",&local_79);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_60,value);
          std::__cxx11::string::~string((string *)&local_60);
        }
        cmXMLWriter::EndElement(xml);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_78);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      cmXMLWriter::EndElement(xml);
    }
    pcVar1 = (cmState *)local_40[0x18]._M_right;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Label",(allocator<char> *)&local_78);
    pcVar4 = cmState::GetGlobalProperty(pcVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (pcVar4 != (char *)0x0) {
      local_60._M_dataplus._M_p = pcVar4;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Labels",(allocator<char> *)&local_78);
      cmXMLWriter::StartElement(xml,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Label",(allocator<char> *)&local_78);
      cmXMLWriter::Element<char_const*>(xml,&local_a0,(char **)&local_60);
      std::__cxx11::string::~string((string *)&local_a0);
      cmXMLWriter::EndElement(xml);
    }
  }
  return;
}

Assistant:

void cmCTest::AddSiteProperties(cmXMLWriter& xml)
{
  cmCTestScriptHandler* ch =
    static_cast<cmCTestScriptHandler*>(this->GetHandler("script"));
  cmake* cm = ch->GetCMake();
  // if no CMake then this is the old style script and props like
  // this will not work anyway.
  if (!cm) {
    return;
  }
  // This code should go when cdash is changed to use labels only
  const char* subproject = cm->GetState()->GetGlobalProperty("SubProject");
  if (subproject) {
    xml.StartElement("Subproject");
    xml.Attribute("name", subproject);
    const char* labels =
      ch->GetCMake()->GetState()->GetGlobalProperty("SubProjectLabels");
    if (labels) {
      xml.StartElement("Labels");
      std::string l = labels;
      std::vector<std::string> args;
      cmSystemTools::ExpandListArgument(l, args);
      for (std::string const& i : args) {
        xml.Element("Label", i);
      }
      xml.EndElement();
    }
    xml.EndElement();
  }

  // This code should stay when cdash only does label based sub-projects
  const char* label = cm->GetState()->GetGlobalProperty("Label");
  if (label) {
    xml.StartElement("Labels");
    xml.Element("Label", label);
    xml.EndElement();
  }
}